

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O0

void __thiscall hiberlite::real_bean<A>::save(real_bean<A> *this)

{
  bean_key local_28;
  real_bean<A> *local_10;
  real_bean<A> *this_local;
  
  if (((this->forgotten & 1U) == 0) && (this->obj != (A *)0x0)) {
    local_10 = this;
    bean_key::bean_key(&local_28,&this->key);
    Database::dbUpdate<A>(&local_28,this->obj);
    bean_key::~bean_key(&local_28);
  }
  return;
}

Assistant:

void real_bean<C>::save() {
	if(forgotten)
		return;
	if(!obj)
		return;
	Database::dbUpdate(key, *obj);
}